

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-strtod.cc
# Opt level: O3

void TestRandomStrtof(void)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  undefined8 uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  int exponent;
  float fVar8;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  Vector<const_char> buffer_02;
  Vector<const_char> buffer_03;
  char buffer [1024];
  double_conversion local_438 [1032];
  
  uVar5 = 1;
  do {
    bVar2 = true;
    do {
      bVar1 = bVar2;
      uVar3 = 0;
      do {
        if (DeterministicRandom()::hi == 0) {
          DeterministicRandom()::hi = 0xbfe166e7;
        }
        if (DeterministicRandom()::lo == 0) {
          DeterministicRandom()::lo = 0x64d1c3c9;
        }
        DeterministicRandom()::hi =
             (DeterministicRandom()::hi >> 0x10) + (DeterministicRandom()::hi & 0xffff) * 0x9069;
        DeterministicRandom()::lo =
             (DeterministicRandom()::lo >> 0x10) + (DeterministicRandom()::lo & 0xffff) * 0x4761;
        local_438[uVar3] =
             (double_conversion)
             ((char)DeterministicRandom()::lo +
              (char)((DeterministicRandom()::lo & 0xffff | DeterministicRandom()::hi * 0x10000) / 10
                    ) * -10 | 0x30);
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
      if (DeterministicRandom()::hi == 0) {
        DeterministicRandom()::hi = 0xbfe166e7;
      }
      if (DeterministicRandom()::lo == 0) {
        DeterministicRandom()::lo = 0x64d1c3c9;
      }
      DeterministicRandom()::hi =
           (DeterministicRandom()::hi >> 0x10) + (DeterministicRandom()::hi & 0xffff) * 0x9069;
      DeterministicRandom()::lo =
           (DeterministicRandom()::lo >> 0x10) + (DeterministicRandom()::lo & 0xffff) * 0x4761;
      uVar6 = DeterministicRandom()::lo & 0xffff | DeterministicRandom()::hi * 0x10000;
      iVar7 = ((uVar6 - (uVar6 / 0xb + (uVar6 / 0xb) * 10)) - (int)uVar5) + -5;
      local_438[uVar5 & 0xffffffff] = (double_conversion)0x0;
      buffer_00.start_ = uVar5 & 0xffffffff;
      buffer_00.length_ = iVar7;
      buffer_00._12_4_ = 0;
      fVar8 = double_conversion::Strtof(local_438,buffer_00,(uVar6 / 0xb) * 5);
      buffer_02._8_8_ = uVar5 & 0xffffffff;
      buffer_02.start_ = (char *)local_438;
      bVar2 = CheckFloat(buffer_02,iVar7,fVar8);
      if (!bVar2) {
        uVar4 = 0x40b;
        goto LAB_00877932;
      }
      bVar2 = false;
    } while (bVar1);
    uVar5 = uVar5 + 1;
    if (uVar5 == 0xf) {
      uVar5 = 0xf;
      do {
        bVar2 = true;
        do {
          bVar1 = bVar2;
          uVar3 = 0;
          do {
            if (DeterministicRandom()::hi == 0) {
              DeterministicRandom()::hi = 0xbfe166e7;
            }
            if (DeterministicRandom()::lo == 0) {
              DeterministicRandom()::lo = 0x64d1c3c9;
            }
            DeterministicRandom()::hi =
                 (DeterministicRandom()::hi >> 0x10) + (DeterministicRandom()::hi & 0xffff) * 0x9069
            ;
            DeterministicRandom()::lo =
                 (DeterministicRandom()::lo >> 0x10) + (DeterministicRandom()::lo & 0xffff) * 0x4761
            ;
            local_438[uVar3] =
                 (double_conversion)
                 ((char)DeterministicRandom()::lo +
                  (char)((DeterministicRandom()::lo & 0xffff | DeterministicRandom()::hi * 0x10000)
                        / 10) * -10 | 0x30);
            uVar3 = uVar3 + 1;
          } while (uVar5 != uVar3);
          if (DeterministicRandom()::hi == 0) {
            DeterministicRandom()::hi = 0xbfe166e7;
          }
          if (DeterministicRandom()::lo == 0) {
            DeterministicRandom()::lo = 0x64d1c3c9;
          }
          DeterministicRandom()::hi =
               (DeterministicRandom()::hi >> 0x10) + (DeterministicRandom()::hi & 0xffff) * 0x9069;
          iVar7 = (DeterministicRandom()::lo & 0xffff) * 0x4761;
          DeterministicRandom()::lo = (DeterministicRandom()::lo >> 0x10) + iVar7;
          exponent = ((DeterministicRandom()::lo & 0xffff | DeterministicRandom()::hi * 0x10000) %
                      0x4d - (int)uVar5) + -0x26;
          local_438[uVar5 & 0xffffffff] = (double_conversion)0x0;
          buffer_01.start_ = uVar5 & 0xffffffff;
          buffer_01.length_ = exponent;
          buffer_01._12_4_ = 0;
          fVar8 = double_conversion::Strtof(local_438,buffer_01,iVar7);
          buffer_03._8_8_ = uVar5 & 0xffffffff;
          buffer_03.start_ = (char *)local_438;
          bVar2 = CheckFloat(buffer_03,exponent,fVar8);
          if (!bVar2) {
            uVar4 = 0x418;
LAB_00877932:
            printf("%s:%d:\n CHECK(%s) failed\n",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-strtod.cc"
                   ,uVar4,"CheckFloat(vector, exponent, strtof_result)");
            abort();
          }
          bVar2 = false;
        } while (bVar1);
        bVar2 = 0x31d < uVar5;
        uVar5 = uVar5 + 2;
        if (bVar2) {
          return;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

TEST(RandomStrtof) {
  char buffer[kBufferSize];
  for (int length = 1; length < 15; length++) {
    for (int i = 0; i < kShortStrtofRandomCount; ++i) {
      int pos = 0;
      for (int j = 0; j < length; ++j) {
        buffer[pos++] = DeterministicRandom() % 10 + '0';
      }
      int exponent = DeterministicRandom() % (5*2 + 1) - 5 - length;
      buffer[pos] = '\0';
      Vector<const char> vector(buffer, pos);
      float strtof_result = Strtof(vector, exponent);
      CHECK(CheckFloat(vector, exponent, strtof_result));
    }
  }
  for (int length = 15; length < 800; length += 2) {
    for (int i = 0; i < kLargeStrtofRandomCount; ++i) {
      int pos = 0;
      for (int j = 0; j < length; ++j) {
        buffer[pos++] = DeterministicRandom() % 10 + '0';
      }
      int exponent = DeterministicRandom() % (38*2 + 1) - 38 - length;
      buffer[pos] = '\0';
      Vector<const char> vector(buffer, pos);
      float strtof_result = Strtof(vector, exponent);
      CHECK(CheckFloat(vector, exponent, strtof_result));
    }
  }
}